

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

ngram_file_type_t ngram_file_name_to_type(char *file_name)

{
  int32 iVar1;
  char *pcVar2;
  char *pcVar3;
  ngram_file_type_t nVar4;
  
  pcVar2 = strrchr(file_name,0x2e);
  if (pcVar2 == (char *)0x0) {
    return NGRAM_INVALID;
  }
  iVar1 = strcmp_nocase(pcVar2,".gz");
  if (iVar1 == 0) {
    pcVar2 = pcVar2 + -1;
    do {
      pcVar3 = pcVar2;
      if (pcVar3 < file_name) {
        return NGRAM_INVALID;
      }
      pcVar2 = pcVar3 + -1;
    } while (*pcVar3 != '.');
  }
  else {
    iVar1 = strcmp_nocase(pcVar2,".bz2");
    if (iVar1 != 0) goto LAB_001048f0;
    pcVar2 = pcVar2 + -1;
    do {
      pcVar3 = pcVar2;
      if (pcVar3 < file_name) {
        return NGRAM_INVALID;
      }
      pcVar2 = pcVar3 + -1;
    } while (*pcVar3 != '.');
  }
  if (pcVar3 < file_name) {
    return NGRAM_INVALID;
  }
  pcVar2 = pcVar2 + 1;
LAB_001048f0:
  iVar1 = strncmp_nocase(pcVar2,".ARPA",5);
  if (iVar1 == 0) {
    nVar4 = NGRAM_ARPA;
  }
  else {
    iVar1 = strncmp_nocase(pcVar2,".DMP",4);
    if (iVar1 == 0) {
      nVar4 = NGRAM_BIN;
    }
    else {
      iVar1 = strncmp_nocase(pcVar2,".BIN",4);
      nVar4 = -(uint)(iVar1 != 0) | NGRAM_BIN;
    }
  }
  return nVar4;
}

Assistant:

ngram_file_type_t
ngram_file_name_to_type(const char *file_name)
{
    const char *ext;

    ext = strrchr(file_name, '.');
    if (ext == NULL) {
        return NGRAM_INVALID;
    }
    if (0 == strcmp_nocase(ext, ".gz")) {
        while (--ext >= file_name) {
            if (*ext == '.')
                break;
        }
        if (ext < file_name) {
            return NGRAM_INVALID;
        }
    }
    else if (0 == strcmp_nocase(ext, ".bz2")) {
        while (--ext >= file_name) {
            if (*ext == '.')
                break;
        }
        if (ext < file_name) {
            return NGRAM_INVALID;
        }
    }
    /* We use strncmp because there might be a .gz on the end. */
    if (0 == strncmp_nocase(ext, ".ARPA", 5))
        return NGRAM_ARPA;
    if (0 == strncmp_nocase(ext, ".DMP", 4)
        || 0 == strncmp_nocase(ext, ".BIN", 4))
        return NGRAM_BIN;
    return NGRAM_INVALID;
}